

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform_authentication(connectdata *conn)

{
  _Bool _Var1;
  saslprogress local_2c;
  anon_union_224_10_26c073a1_for_proto *paStack_28;
  saslprogress progress;
  smtp_conn *smtpc;
  connectdata *pcStack_18;
  CURLcode result;
  connectdata *conn_local;
  
  smtpc._4_4_ = CURLE_OK;
  paStack_28 = &conn->proto;
  pcStack_18 = conn;
  if ((((conn->proto).imapc.resptag[2] & 1U) == 0) ||
     (_Var1 = Curl_sasl_can_authenticate((SASL *)&(conn->proto).imapc.sasl.state,conn), !_Var1)) {
    state(pcStack_18,SMTP_STOP);
    conn_local._4_4_ = smtpc._4_4_;
  }
  else {
    smtpc._4_4_ = Curl_sasl_start((SASL *)&(paStack_28->imapc).sasl.state,pcStack_18,false,&local_2c
                                 );
    if (smtpc._4_4_ == CURLE_OK) {
      if (local_2c == SASL_INPROGRESS) {
        state(pcStack_18,SMTP_AUTH);
      }
      else {
        Curl_infof(pcStack_18->data,"No known authentication mechanisms supported!\n");
        smtpc._4_4_ = CURLE_LOGIN_DENIED;
      }
    }
    conn_local._4_4_ = smtpc._4_4_;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smtp_perform_authentication(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  saslprogress progress;

  /* Check we have enough data to authenticate with, and the
     server supports authentiation, and end the connect phase if not */
  if(!smtpc->auth_supported ||
      !Curl_sasl_can_authenticate(&smtpc->sasl, conn)) {
    state(conn, SMTP_STOP);
    return result;
  }

  /* Calculate the SASL login details */
  result = Curl_sasl_start(&smtpc->sasl, conn, FALSE, &progress);

  if(!result) {
    if(progress == SASL_INPROGRESS)
      state(conn, SMTP_AUTH);
    else {
      /* Other mechanisms not supported */
      infof(conn->data, "No known authentication mechanisms supported!\n");
      result = CURLE_LOGIN_DENIED;
    }
  }

  return result;
}